

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::setBCoeffs
          (MLEBABecLap *this,int amrlev,Array<const_MultiFab_*,_3> *beta,Location a_beta_loc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference ppMVar4;
  undefined4 in_ECX;
  long *in_RDI;
  int icomp_1;
  int idim_1;
  int icomp;
  int idim;
  int beta_ncomp;
  int ncomp;
  char *in_stack_000001a8;
  int in_stack_000001b4;
  char *in_stack_000001b8;
  char *in_stack_000001c0;
  size_type in_stack_ffffffffffffff88;
  array<amrex::MultiFab,_3UL> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb8;
  
  iVar1 = (**(code **)(*in_RDI + 0x28))();
  ppMVar4 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffff90,
                       in_stack_ffffffffffffff88);
  iVar2 = FabArrayBase::nComp((FabArrayBase *)*ppMVar4);
  *(undefined4 *)(in_RDI + 0x65) = in_ECX;
  if ((iVar2 != 1) && (iVar2 != iVar1)) {
    Assert_host(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001a8);
  }
  ppMVar4 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffff90,
                       in_stack_ffffffffffffff88);
  iVar3 = FabArrayBase::nComp((FabArrayBase *)*ppMVar4);
  if (iVar3 == iVar1) {
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::array<amrex::MultiFab,_3UL>::operator[]
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
        MultiFab::Copy((MultiFab *)CONCAT44(in_ECX,iVar1),(MultiFab *)CONCAT44(iVar2,iVar3),iVar5,
                       in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                      );
      }
    }
  }
  else {
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff90 =
             (array<amrex::MultiFab,_3UL> *)
             std::array<amrex::MultiFab,_3UL>::operator[]
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
        MultiFab::Copy((MultiFab *)CONCAT44(in_ECX,iVar1),
                       (MultiFab *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb4,iVar3,iVar5,in_stack_ffffffffffffffa8);
      }
    }
  }
  *(undefined1 *)((long)in_RDI + 0x324) = 1;
  return;
}

Assistant:

void
MLEBABecLap::setBCoeffs (int amrlev, const Array<MultiFab const*,AMREX_SPACEDIM>& beta,
                         Location a_beta_loc)
{
    const int ncomp = getNComp();
    const int beta_ncomp = beta[0]->nComp();

    m_beta_loc     = a_beta_loc;

    AMREX_ALWAYS_ASSERT(beta_ncomp == 1 || beta_ncomp == ncomp);
    if (beta[0]->nComp() == ncomp) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                MultiFab::Copy(m_b_coeffs[amrlev][0][idim], *beta[idim], icomp, icomp, 1, 0);
            }
        }
    } else {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                MultiFab::Copy(m_b_coeffs[amrlev][0][idim], *beta[idim], 0, icomp, 1, 0);
            }
        }
    }
    m_needs_update = true;
}